

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildValue.h
# Opt level: O0

void __thiscall
llbuild::buildsystem::BuildValue::BuildValue
          (BuildValue *this,Kind kind,FileInfo directoryInfo,
          ArrayRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          values)

{
  ArrayRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  values_00;
  bool bVar1;
  StringList local_50;
  CommandSignature local_40;
  ArrayRef<llbuild::basic::FileInfo> local_38;
  Kind local_24;
  BuildValue *pBStack_20;
  Kind kind_local;
  BuildValue *this_local;
  ArrayRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  values_local;
  
  values_local.Data =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)values.Length;
  this_local = (BuildValue *)values.Data;
  local_24 = kind;
  pBStack_20 = this;
  llvm::ArrayRef<llbuild::basic::FileInfo>::ArrayRef(&local_38,&directoryInfo);
  memset(&local_40,0,8);
  basic::CommandSignature::CommandSignature(&local_40);
  BuildValue(this,kind,local_38,local_40);
  bVar1 = kindHasStringList(this);
  if (!bVar1) {
    __assert_fail("kindHasStringList()",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llbuild/BuildSystem/BuildValue.h"
                  ,0xac,
                  "llbuild::buildsystem::BuildValue::BuildValue(Kind, FileInfo, ArrayRef<std::string>)"
                 );
  }
  values_00.Length = (size_type)values_local.Data;
  values_00.Data = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_local;
  basic::StringList::StringList<std::__cxx11::string>(&local_50,values_00);
  basic::StringList::operator=(&this->stringValues,&local_50);
  basic::StringList::~StringList(&local_50);
  return;
}

Assistant:

BuildValue(Kind kind, FileInfo directoryInfo, ArrayRef<std::string> values)
      : BuildValue(kind, directoryInfo)
  {
    assert(kindHasStringList());

    stringValues = basic::StringList(values);
  }